

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::CommandLineFlag*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::lts_20240722::CommandLineFlag*>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>,std::tuple<absl::lts_20240722::CommandLineFlag*&&>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20240722::CommandLineFlag*>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,absl::lts_20240722::CommandLineFlag*>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_1,
          tuple<absl::lts_20240722::CommandLineFlag_*&&> *args_2)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  CommandLineFlag **ppCVar2;
  char *pcVar3;
  bool bVar4;
  reference key;
  iterator local_48;
  iterator local_38;
  iterator local_20;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  pbVar1 = (args_1->super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>
           ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false>.
           _M_head_impl;
  ppCVar2 = (args_2->super__Tuple_impl<0UL,_absl::lts_20240722::CommandLineFlag_*&&>).
            super__Head_base<0UL,_absl::lts_20240722::CommandLineFlag_*&&,_false>._M_head_impl;
  pcVar3 = pbVar1->_M_str;
  *(size_t *)local_38.field_1.slot_ = pbVar1->_M_len;
  *(char **)((long)local_38.field_1.slot_ + 8) = pcVar3;
  *(CommandLineFlag **)((long)local_38.field_1.slot_ + 0x10) = *ppCVar2;
  key = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::CommandLineFlag_*>_>_>
        ::iterator::operator*(&local_38);
  local_20 = find<std::basic_string_view<char,std::char_traits<char>>>(this,&key->first);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1.slot_ = (slot_type *)local_38.field_1;
  bVar4 = operator==(&local_20,&local_48);
  if (bVar4) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf3f,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, absl::CommandLineFlag *>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, absl::CommandLineFlag *>>, Args = <const std::piecewise_construct_t &, std::tuple<std::basic_string_view<char> &&>, std::tuple<absl::CommandLineFlag *&&>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }